

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QLocale::Country>::emplace<QLocale::Country&>
          (QPodArrayOps<QLocale::Country> *this,qsizetype i,Country *args)

{
  qsizetype *pqVar1;
  Country CVar2;
  Data *pDVar3;
  long lVar4;
  qsizetype qVar5;
  Country *pCVar6;
  GrowthPosition where;
  
  pDVar3 = (this->super_QArrayDataPointer<QLocale::Country>).d;
  if ((pDVar3 != (Data *)0x0) &&
     ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<QLocale::Country>).size == i) &&
       (qVar5 = QArrayDataPointer<QLocale::Country>::freeSpaceAtEnd
                          (&this->super_QArrayDataPointer<QLocale::Country>), qVar5 != 0)) {
      lVar4 = (this->super_QArrayDataPointer<QLocale::Country>).size;
      (this->super_QArrayDataPointer<QLocale::Country>).ptr[lVar4] = *args;
      (this->super_QArrayDataPointer<QLocale::Country>).size = lVar4 + 1;
      return;
    }
    if ((i == 0) &&
       (qVar5 = QArrayDataPointer<QLocale::Country>::freeSpaceAtBegin
                          (&this->super_QArrayDataPointer<QLocale::Country>), qVar5 != 0)) {
      pCVar6 = (this->super_QArrayDataPointer<QLocale::Country>).ptr;
      pCVar6[-1] = *args;
      (this->super_QArrayDataPointer<QLocale::Country>).ptr = pCVar6 + -1;
      pqVar1 = &(this->super_QArrayDataPointer<QLocale::Country>).size;
      *pqVar1 = *pqVar1 + 1;
      return;
    }
  }
  CVar2 = *args;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<QLocale::Country>).size != 0);
  QArrayDataPointer<QLocale::Country>::detachAndGrow
            (&this->super_QArrayDataPointer<QLocale::Country>,where,1,(Country **)0x0,
             (QArrayDataPointer<QLocale::Country> *)0x0);
  pCVar6 = createHole(this,where,i,1);
  *pCVar6 = CVar2;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }